

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::ClassDeclarationSyntax::isChildOptional(size_t index)

{
  return (bool)((byte)(0x8e8 >> ((byte)index & 0x1f)) & index < 0xc);
}

Assistant:

bool ClassDeclarationSyntax::isChildOptional(size_t index) {
    switch (index) {
        case 3: return true;
        case 5: return true;
        case 6: return true;
        case 7: return true;
        case 11: return true;
        default: return false;
    }
}